

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *pAVar2;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_00;
  _func_int **pp_Var3;
  void *in_R8;
  _func_int **pp_Var4;
  Own<kj::_::ChainPromiseNode> OVar5;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar6;
  Promise<unsigned_long> PVar7;
  Fault f;
  Promise<unsigned_long> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Fault local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  BlockedPumpFrom *local_38;
  
  local_38 = this;
  if (*(long *)((long)readBuffer + 0x38) == 0) {
    pp_Var4 = (_func_int **)
              (*(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30));
    pp_Var3 = (_func_int **)maxBytes;
    if (pp_Var4 < maxBytes) {
      pp_Var3 = pp_Var4;
    }
    (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
              (&local_68,*(long **)((long)readBuffer + 0x20),minBytes,pp_Var3);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x50);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:505:17),_kj::_::PropagateException>
               ::anon_class_40_5_41c1fbba_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062af08;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)readBuffer;
    this_00[1].dependency.disposer = (Disposer *)minBytes;
    this_00[1].dependency.ptr = (PromiseNode *)maxBytes;
    this_00[1].continuationTracePtr = in_R8;
    this_00[2].super_PromiseNode._vptr_PromiseNode = pp_Var3;
    local_58.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_58.ptr = (PromiseNode *)this_00;
    OVar5 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_58);
    pPVar1 = local_58.ptr;
    local_78.super_PromiseBase.node.disposer._0_4_ = local_48.exception._0_4_;
    local_78.super_PromiseBase.node.disposer._4_4_ = local_48.exception._4_4_;
    local_78.super_PromiseBase.node.ptr = (PromiseNode *)CONCAT44(uStack_3c,uStack_40);
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar5.ptr);
    }
    OVar6 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                      ((kj *)&local_48,(Canceler *)((long)readBuffer + 0x38),&local_78);
    pPVar1 = local_78.super_PromiseBase.node.ptr;
    pAVar2 = OVar6.ptr;
    *(undefined4 *)&(local_38->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_48.exception._0_4_;
    *(undefined4 *)
     ((long)&(local_38->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_48.exception._4_4_;
    *(undefined4 *)&(local_38->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream
         = uStack_40;
    *(undefined4 *)
     ((long)&(local_38->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uStack_3c;
    if (local_78.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_78.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                           local_78.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                          local_78.super_PromiseBase.node.disposer._0_4_),
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
      pAVar2 = extraout_RDX;
    }
    pPVar1 = local_68.ptr;
    if (local_68.ptr != (PromiseNode *)0x0) {
      local_68.ptr = (PromiseNode *)0x0;
      (**(local_68.disposer)->_vptr_Disposer)
                (local_68.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode)
      ;
      pAVar2 = extraout_RDX_00;
    }
    PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pAVar2;
    PVar7.super_PromiseBase.node.disposer = (Disposer *)local_38;
    return (Promise<unsigned_long>)PVar7.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,499,FAILED,"canceler.isEmpty()","\"already pumping\"",(char (*) [16])"already pumping"
            );
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

Promise<size_t> tryRead(void* readBuffer, size_t minBytes, size_t maxBytes) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto pumpLeft = amount - pumpedSoFar;
      auto min = kj::min(pumpLeft, minBytes);
      auto max = kj::min(pumpLeft, maxBytes);
      return canceler.wrap(input.tryRead(readBuffer, min, max)
          .then([this,readBuffer,minBytes,maxBytes,min](size_t actual) -> kj::Promise<size_t> {
        canceler.release();
        pumpedSoFar += actual;
        KJ_ASSERT(pumpedSoFar <= amount);

        if (pumpedSoFar == amount || actual < min) {
          // Either we pumped all we wanted or we hit EOF.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
        }

        if (actual >= minBytes) {
          return actual;
        } else {
          return pipe.tryRead(reinterpret_cast<byte*>(readBuffer) + actual,
                              minBytes - actual, maxBytes - actual)
              .then([actual](size_t actual2) { return actual + actual2; });
        }
      }));
    }